

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one-of.h
# Opt level: O2

void __thiscall
kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::moveFrom
          (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *this,
          OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *other)

{
  this->tag = other->tag;
  moveVariantFrom<kj::HttpInputStream::Request>(this,other);
  moveVariantFrom<kj::HttpInputStream::Connect>(this,other);
  return;
}

Assistant:

void moveFrom(OneOf& other) {
    // Initialize as a copy of `other`.  Expects that `this` starts out uninitialized, so the tag
    // is invalid.
    tag = other.tag;
    doAll(moveVariantFrom<Variants>(other)...);
  }